

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

shared_ptr<cs::name_space> * __thiscall
cs_impl::any::val<std::shared_ptr<cs::name_space>>(any *this)

{
  bool bVar1;
  undefined8 uVar2;
  string *str;
  shared_ptr<cs::name_space> *psVar3;
  long *in_RDI;
  type_info *in_stack_ffffffffffffff38;
  error *in_stack_ffffffffffffff40;
  error *this_00;
  undefined1 local_89 [39];
  undefined1 local_62;
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  type((any *)in_stack_ffffffffffffff40);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    local_3d = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"E0006",&local_29);
    cov::error::error(in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38);
    local_3d = 0;
    __cxa_throw(uVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (*in_RDI == 0) {
    local_62 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"E0005",&local_61);
    cov::error::error(in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38);
    local_62 = 0;
    __cxa_throw(uVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (1 < *(short *)(*in_RDI + 2)) {
    str = (string *)__cxa_allocate_exception(0x28);
    this_00 = (error *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"E000K",(allocator *)this_00);
    cov::error::error(this_00,str);
    __cxa_throw(str,&cov::error::typeinfo,cov::error::~error);
  }
  psVar3 = holder<std::shared_ptr<cs::name_space>_>::data
                     (*(holder<std::shared_ptr<cs::name_space>_> **)(*in_RDI + 0x10));
  return psVar3;
}

Assistant:

T &val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			if (this->mDat->protect_level > 1)
				throw cov::error("E000K");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}